

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

int __thiscall
semver::detail::prerelease_comparator::compare<int,int,int>
          (prerelease_comparator *this,version<int,_int,_int> *lhs,version<int,_int,_int> *rhs)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  unsigned_long *puVar6;
  const_reference lhs_00;
  const_reference rhs_00;
  size_type sStack_48;
  int compare_result;
  size_t i;
  size_type local_38;
  ulong local_30;
  size_t count;
  version<int,_int,_int> *rhs_local;
  version<int,_int,_int> *lhs_local;
  prerelease_comparator *this_local;
  
  count = (size_t)rhs;
  rhs_local = lhs;
  lhs_local = (version<int,_int,_int> *)this;
  bVar1 = std::
          vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
          ::empty(&lhs->prerelease_identifiers);
  bVar2 = std::
          vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
          ::empty((vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                   *)(count + 0x50));
  if (bVar1 == bVar2) {
    local_38 = std::
               vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
               ::size(&rhs_local->prerelease_identifiers);
    i = std::
        vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
        ::size((vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                *)(count + 0x50));
    puVar6 = Catch::clara::std::min<unsigned_long>(&local_38,&i);
    local_30 = *puVar6;
    for (sStack_48 = 0; sStack_48 < local_30; sStack_48 = sStack_48 + 1) {
      lhs_00 = std::
               vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
               ::operator[](&rhs_local->prerelease_identifiers,sStack_48);
      rhs_00 = std::
               vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
               ::operator[]((vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                             *)(count + 0x50),sStack_48);
      iVar3 = compare_identifier(this,lhs_00,rhs_00);
      if (iVar3 != 0) {
        return iVar3;
      }
    }
    sVar4 = std::
            vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
            ::size(&rhs_local->prerelease_identifiers);
    sVar5 = std::
            vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
            ::size((vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                    *)(count + 0x50));
    this_local._4_4_ = (int)sVar4 - (int)sVar5;
  }
  else {
    sVar4 = std::
            vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
            ::size((vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                    *)(count + 0x50));
    sVar5 = std::
            vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
            ::size(&rhs_local->prerelease_identifiers);
    this_local._4_4_ = (int)sVar4 - (int)sVar5;
  }
  return this_local._4_4_;
}

Assistant:

[[nodiscard]] SEMVER_CONSTEXPR int compare(const version<I1, I2, I3>& lhs, const version<I1, I2, I3>& rhs) const noexcept {
    if (lhs.prerelease_identifiers.empty() != rhs.prerelease_identifiers.empty()) {
      return static_cast<int>(rhs.prerelease_identifiers.size()) - static_cast<int>(lhs.prerelease_identifiers.size());
    }

    const std::size_t count = std::min(lhs.prerelease_identifiers.size(), rhs.prerelease_identifiers.size());

    for (std::size_t i = 0; i < count; ++i) {
      const int compare_result = compare_identifier(lhs.prerelease_identifiers[i], rhs.prerelease_identifiers[i]);
      if (compare_result != 0) {
        return compare_result;
      }
    }

    return static_cast<int>(lhs.prerelease_identifiers.size()) - static_cast<int>(rhs.prerelease_identifiers.size());
  }